

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.cpp
# Opt level: O0

string * __thiscall so_5::agent_t::so_coop_name_abi_cxx11_(agent_t *this)

{
  exception_t *this_00;
  string *psVar1;
  allocator local_31;
  string local_30 [32];
  agent_t *local_10;
  agent_t *this_local;
  
  local_10 = this;
  if (this->m_agent_coop == (coop_t *)0x0) {
    this_00 = (exception_t *)__cxa_allocate_exception(0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"agent isn\'t bound to cooperation yet",&local_31);
    exception_t::exception_t(this_00,(string *)local_30,0xe);
    __cxa_throw(this_00,&exception_t::typeinfo,exception_t::~exception_t);
  }
  psVar1 = coop_t::query_coop_name_abi_cxx11_(this->m_agent_coop);
  return psVar1;
}

Assistant:

const std::string &
agent_t::so_coop_name() const
{
	if( 0 == m_agent_coop )
		throw exception_t(
			"agent isn't bound to cooperation yet",
			rc_agent_has_no_cooperation );

	return m_agent_coop->query_coop_name();
}